

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_Brep::FlipReversedSurfaces(ON_Brep *this)

{
  uint uVar1;
  int iVar2;
  ON_BrepFace *pOVar3;
  byte bVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  
  uVar1 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
  iVar2 = this->m_is_solid;
  uVar7 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar7;
  }
  bVar6 = true;
  for (; uVar5 * 0xd8 - uVar7 != 0; uVar7 = uVar7 + 0xd8) {
    pOVar3 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    if ((pOVar3->m_face_uuid).Data4[uVar7 - 0x10] == '\x01') {
      bVar4 = (**(code **)(*(long *)((pOVar3->m_face_uuid).Data4 + (uVar7 - 0x5c)) + 0x1b0))();
      bVar6 = (bool)(bVar6 & bVar4);
    }
  }
  this->m_is_solid = iVar2;
  return bVar6;
}

Assistant:

bool
ON_Brep::FlipReversedSurfaces()
{
  // Clears all ON_BrepFace.m_bRev flags
  // by calling SwapFaceParameters() on each
  // face with a true m_bRev.
  //
  // Returns true if successful.

  // 11 April 2008 Dale Lear and Tim:
  //   face.Transpose() is clearing the m_is_solid
  //   flag but we are not changing the orientation
  //   of the brep.  This prevents having to perform
  //   the expensive step of calculating this flag
  //   again.
  int saved_is_solid = m_is_solid;

  const int face_count = m_F.Count();

  bool rc = true;
  int fi;
  for ( fi = 0; fi < face_count; fi++ ) 
  {
    ON_BrepFace& face = m_F[fi];
    if ( face.m_bRev )
    {
      if ( !face.Transpose() )
        rc = false;
    }
  }

  m_is_solid = saved_is_solid;

  return rc;
}